

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

cTValue * lj_tab_getstr(GCtab *t,GCstr *key)

{
  cTValue *local_40;
  Node *n;
  GCstr *key_local;
  GCtab *t_local;
  Node *n_1;
  
  local_40 = (cTValue *)((t->node).ptr64 + (ulong)(key->sid & t->hmask) * 0x18);
  while (((int)local_40[1].field_4.it >> 0xf != -5 ||
         ((GCstr *)(local_40[1].u64 & 0x7fffffffffff) != key))) {
    local_40 = (cTValue *)local_40[2].u64;
    if (local_40 == (cTValue *)0x0) {
      return (cTValue *)0x0;
    }
  }
  return local_40;
}

Assistant:

cTValue *lj_tab_getstr(GCtab *t, const GCstr *key)
{
  Node *n = hashstr(t, key);
  do {
    if (tvisstr(&n->key) && strV(&n->key) == key)
      return &n->val;
  } while ((n = nextnode(n)));
  return NULL;
}